

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnt_st_seg.c
# Opt level: O0

uint32 * cnt_st_seg(model_def_t *mdef,lexicon_t *lex)

{
  int iVar1;
  uint32 *puVar2;
  uint32 *ptr;
  uint local_34;
  uint32 i;
  uint32 *n_frame_per;
  uint32 *sseq;
  uint32 n_frame;
  uint32 seq_no;
  lexicon_t *lex_local;
  model_def_t *mdef_local;
  
  _n_frame = lex;
  lex_local = (lexicon_t *)mdef;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
          ,0x62,"Counting # occ. for %u tied states\n",(ulong)mdef->n_tied_state);
  puVar2 = (uint32 *)
           __ckd_calloc__((ulong)*(uint *)&lex_local[1].field_0x4,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
                          ,100);
  sseq._4_4_ = corpus_get_begin();
  while( true ) {
    iVar1 = corpus_next_utt();
    if (iVar1 == 0) break;
    if (sseq._4_4_ % 0xfa == 0) {
      err_msg(ERR_INFOCONT,(char *)0x0,0," cnt[%u]",(ulong)sseq._4_4_);
    }
    ptr = get_next_sseq((model_def_t *)lex_local,_n_frame,(uint32 *)&sseq);
    if (ptr == (uint32 *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
              ,0x6f,"senone sequence not produced; skipping.\n");
    }
    else {
      for (local_34 = 0; local_34 < (uint)sseq; local_34 = local_34 + 1) {
        puVar2[ptr[local_34]] = puVar2[ptr[local_34]] + 1;
      }
      ckd_free(ptr);
    }
    sseq._4_4_ = sseq._4_4_ + 1;
  }
  for (local_34 = 0; local_34 < *(uint *)&lex_local[1].field_0x4; local_34 = local_34 + 1) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
            ,0x7c,"ts= %u cnt= %u\n",(ulong)local_34,(ulong)puVar2[local_34]);
  }
  return puVar2;
}

Assistant:

uint32 *
cnt_st_seg(model_def_t *mdef,
	   lexicon_t *lex)
{
    uint32 seq_no;
    uint32 n_frame;
    uint32 *sseq;
    uint32 *n_frame_per;
    uint32 i;

    E_INFO("Counting # occ. for %u tied states\n", mdef->n_tied_state);

    n_frame_per = ckd_calloc(mdef->n_tied_state, sizeof(uint32));

    for (seq_no = corpus_get_begin(); corpus_next_utt(); seq_no++) {
	if (!(seq_no % 250)) {
	    E_INFOCONT(" cnt[%u]", seq_no);
	}
	
	/* Read transcript and convert it into a senone sequence */
	sseq = get_next_sseq(mdef, lex, &n_frame);

	if (sseq == NULL) {
	    E_WARN("senone sequence not produced; skipping.\n");

	    continue;
	}

	for (i = 0; i < n_frame; i++) {
	    n_frame_per[sseq[i]]++;
	}

	ckd_free(sseq);
    }

    for (i = 0; i < mdef->n_tied_state; i++) {
	E_INFO("ts= %u cnt= %u\n", i, n_frame_per[i]);
    }

    return n_frame_per;
}